

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawIndexedTest.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::Draw::anon_unknown_10::DrawInstancedIndexed::iterate
          (TestStatus *__return_storage_ptr__,DrawInstancedIndexed *this)

{
  deInt32 *pdVar1;
  int *piVar2;
  VkPrimitiveTopology VVar3;
  Context *this_00;
  TestLog *pTVar4;
  DeviceInterface *pDVar5;
  SharedPtrStateBase *pSVar6;
  Allocation *pAVar7;
  pointer __dest;
  Buffer *pBVar8;
  deUint64 dVar9;
  Image *this_01;
  void *pvVar10;
  VkQueue pVVar11;
  DrawInstancedIndexed *pDVar12;
  TestStatus *pTVar13;
  bool bVar14;
  VkResult VVar15;
  VkDevice pVVar16;
  Allocator *pAVar17;
  char *__s;
  undefined8 uVar18;
  int y;
  VkDeviceSize _size;
  int x;
  float fVar19;
  float fVar20;
  double dVar21;
  allocator<char> local_169;
  VkQueue local_168;
  DrawInstancedIndexed *local_160;
  undefined8 local_158;
  undefined4 local_150;
  TestStatus *local_148;
  TestLog *local_140;
  double local_138;
  double local_130;
  VkSubmitInfo submitInfo;
  long *local_d8;
  long local_d0;
  long local_c8 [2];
  Texture2D referenceFrame;
  ConstPixelBufferAccess renderedFrame;
  VkBuffer vertexBuffer;
  VkDeviceSize vertexBufferOffset;
  
  this_00 = (this->super_DrawIndexed).super_DrawTestsBaseClass.super_TestInstance.m_context;
  pTVar4 = this_00->m_testCtx->m_log;
  local_168 = Context::getUniversalQueue(this_00);
  DrawTestsBaseClass::beginRenderPass((DrawTestsBaseClass *)this);
  _size = (long)(this->super_DrawIndexed).m_indexes.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->super_DrawIndexed).m_indexes.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
  pDVar5 = (this->super_DrawIndexed).super_DrawTestsBaseClass.m_vk;
  pVVar16 = Context::getDevice((this->super_DrawIndexed).super_DrawTestsBaseClass.super_TestInstance
                               .m_context);
  BufferCreateInfo::BufferCreateInfo
            ((BufferCreateInfo *)&referenceFrame,_size,0x40,VK_SHARING_MODE_EXCLUSIVE,0,
             (deUint32 *)0x0,0);
  local_160 = this;
  pAVar17 = Context::getDefaultAllocator
                      ((this->super_DrawIndexed).super_DrawTestsBaseClass.super_TestInstance.
                       m_context);
  Draw::Buffer::createAndAlloc
            ((Buffer *)&submitInfo,pDVar5,pVVar16,(VkBufferCreateInfo *)&referenceFrame,pAVar17,
             (MemoryRequirement)0x1);
  pDVar12 = local_160;
  pSVar6 = (local_160->super_DrawIndexed).m_indexBuffer.m_state;
  if (pSVar6 == (SharedPtrStateBase *)submitInfo.pNext) {
LAB_006c106c:
    if (submitInfo.pNext != (void *)0x0) {
      LOCK();
      piVar2 = (int *)((long)submitInfo.pNext + 8);
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        submitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
        submitInfo._4_4_ = 0;
        (**(code **)(*submitInfo.pNext + 0x10))();
      }
      LOCK();
      piVar2 = (int *)((long)submitInfo.pNext + 0xc);
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (submitInfo.pNext != (void *)0x0) {
          (**(code **)(*submitInfo.pNext + 8))();
        }
        submitInfo.pNext = (void *)0x0;
      }
    }
  }
  else {
    if (pSVar6 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &pSVar6->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        (local_160->super_DrawIndexed).m_indexBuffer.m_ptr = (Buffer *)0x0;
        (*((local_160->super_DrawIndexed).m_indexBuffer.m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &((pDVar12->super_DrawIndexed).m_indexBuffer.m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        pSVar6 = (pDVar12->super_DrawIndexed).m_indexBuffer.m_state;
        if (pSVar6 != (SharedPtrStateBase *)0x0) {
          (*pSVar6->_vptr_SharedPtrStateBase[1])();
        }
        (pDVar12->super_DrawIndexed).m_indexBuffer.m_state = (SharedPtrStateBase *)0x0;
      }
    }
    (pDVar12->super_DrawIndexed).m_indexBuffer.m_ptr = (Buffer *)submitInfo._0_8_;
    (pDVar12->super_DrawIndexed).m_indexBuffer.m_state = (SharedPtrStateBase *)submitInfo.pNext;
    if (submitInfo.pNext != (void *)0x0) {
      LOCK();
      *(int *)((long)submitInfo.pNext + 8) = *(int *)((long)submitInfo.pNext + 8) + 1;
      UNLOCK();
      LOCK();
      pdVar1 = &((pDVar12->super_DrawIndexed).m_indexBuffer.m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + 1;
      UNLOCK();
      goto LAB_006c106c;
    }
  }
  pvVar10 = (void *)CONCAT44(referenceFrame.m_height,referenceFrame.m_width);
  local_140 = pTVar4;
  if (pvVar10 != (void *)0x0) {
    operator_delete(pvVar10,(long)referenceFrame.m_view.m_levels - (long)pvVar10);
  }
  pAVar7 = (((pDVar12->super_DrawIndexed).m_indexBuffer.m_ptr)->m_allocation).
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  referenceFrame.super_TextureLevelPyramid.m_format = (TextureFormat)&PTR__Allocation_00d1abf8;
  referenceFrame.super_TextureLevelPyramid.m_data.
  super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)(pAVar7->m_memory).m_internal;
  referenceFrame.super_TextureLevelPyramid.m_data.
  super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)pAVar7->m_offset;
  __dest = (pointer)pAVar7->m_hostPtr;
  referenceFrame.super_TextureLevelPyramid.m_data.
  super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = __dest;
  ::vk::Allocation::~Allocation((Allocation *)&referenceFrame);
  memcpy(__dest,(pDVar12->super_DrawIndexed).m_indexes.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start,_size);
  pDVar5 = (pDVar12->super_DrawIndexed).super_DrawTestsBaseClass.m_vk;
  pVVar16 = Context::getDevice((pDVar12->super_DrawIndexed).super_DrawTestsBaseClass.
                               super_TestInstance.m_context);
  pBVar8 = (pDVar12->super_DrawIndexed).m_indexBuffer.m_ptr;
  pAVar7 = (pBVar8->m_allocation).
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  referenceFrame.super_TextureLevelPyramid.m_format = (TextureFormat)&PTR__Allocation_00d1abf8;
  referenceFrame.super_TextureLevelPyramid.m_data.
  super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)(pAVar7->m_memory).m_internal;
  referenceFrame.super_TextureLevelPyramid.m_data.
  super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)pAVar7->m_offset;
  referenceFrame.super_TextureLevelPyramid.m_data.
  super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pAVar7->m_hostPtr;
  pAVar7 = (pBVar8->m_allocation).
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  submitInfo._0_8_ = &PTR__Allocation_00d1abf8;
  submitInfo.pNext = (void *)(pAVar7->m_memory).m_internal;
  submitInfo._16_8_ = pAVar7->m_offset;
  submitInfo.pWaitSemaphores = (VkSemaphore *)pAVar7->m_hostPtr;
  ::vk::flushMappedMemoryRange
            (pDVar5,pVVar16,
             (VkDeviceMemory)
             referenceFrame.super_TextureLevelPyramid.m_data.
             super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start,submitInfo._16_8_,_size);
  ::vk::Allocation::~Allocation((Allocation *)&submitInfo);
  ::vk::Allocation::~Allocation((Allocation *)&referenceFrame);
  dVar9 = (((pDVar12->super_DrawIndexed).m_indexBuffer.m_ptr)->m_object).
          super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  pDVar5 = (pDVar12->super_DrawIndexed).super_DrawTestsBaseClass.m_vk;
  (*pDVar5->_vptr_DeviceInterface[0x58])
            (pDVar5,(pDVar12->super_DrawIndexed).super_DrawTestsBaseClass.m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,0,1);
  pDVar5 = (pDVar12->super_DrawIndexed).super_DrawTestsBaseClass.m_vk;
  (*pDVar5->_vptr_DeviceInterface[0x57])
            (pDVar5,(pDVar12->super_DrawIndexed).super_DrawTestsBaseClass.m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,dVar9,0);
  pDVar5 = (pDVar12->super_DrawIndexed).super_DrawTestsBaseClass.m_vk;
  (*pDVar5->_vptr_DeviceInterface[0x4c])
            (pDVar5,(pDVar12->super_DrawIndexed).super_DrawTestsBaseClass.m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,0,
             (pDVar12->super_DrawIndexed).super_DrawTestsBaseClass.m_pipeline.
             super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal);
  VVar3 = (pDVar12->super_DrawIndexed).super_DrawTestsBaseClass.m_topology;
  if (VVar3 == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST) {
    uVar18 = 6;
  }
  else {
    if (VVar3 != VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP) goto LAB_006c126a;
    uVar18 = 4;
  }
  pDVar5 = (pDVar12->super_DrawIndexed).super_DrawTestsBaseClass.m_vk;
  (*pDVar5->_vptr_DeviceInterface[0x5a])
            (pDVar5,(pDVar12->super_DrawIndexed).super_DrawTestsBaseClass.m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,uVar18,4,2,0xd,2);
LAB_006c126a:
  pDVar5 = (pDVar12->super_DrawIndexed).super_DrawTestsBaseClass.m_vk;
  (*pDVar5->_vptr_DeviceInterface[0x76])
            (pDVar5,(pDVar12->super_DrawIndexed).super_DrawTestsBaseClass.m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object);
  pDVar5 = (pDVar12->super_DrawIndexed).super_DrawTestsBaseClass.m_vk;
  (*pDVar5->_vptr_DeviceInterface[0x4a])
            (pDVar5,(pDVar12->super_DrawIndexed).super_DrawTestsBaseClass.m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object);
  pVVar11 = local_168;
  submitInfo.pNext = (void *)0x0;
  submitInfo.pWaitDstStageMask = (VkPipelineStageFlags *)0x0;
  submitInfo.signalSemaphoreCount = 0;
  submitInfo._60_4_ = 0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
  submitInfo.pSignalSemaphores = (VkSemaphore *)0x0;
  submitInfo.sType = VK_STRUCTURE_TYPE_SUBMIT_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.commandBufferCount = 1;
  submitInfo._44_4_ = 0;
  pDVar5 = (pDVar12->super_DrawIndexed).super_DrawTestsBaseClass.m_vk;
  submitInfo.pCommandBuffers =
       (VkCommandBuffer *)&(pDVar12->super_DrawIndexed).super_DrawTestsBaseClass.m_cmdBuffer;
  VVar15 = (*pDVar5->_vptr_DeviceInterface[2])(pDVar5,local_168,1);
  ::vk::checkResult(VVar15,"m_vk.queueSubmit(queue, 1, &submitInfo, DE_NULL)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktDrawIndexedTest.cpp"
                    ,0x131);
  pDVar5 = (pDVar12->super_DrawIndexed).super_DrawTestsBaseClass.m_vk;
  VVar15 = (*pDVar5->_vptr_DeviceInterface[3])(pDVar5,pVVar11);
  ::vk::checkResult(VVar15,"m_vk.queueWaitIdle(queue)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktDrawIndexedTest.cpp"
                    ,0x133);
  pDVar5 = (pDVar12->super_DrawIndexed).super_DrawTestsBaseClass.m_vk;
  VVar15 = (*pDVar5->_vptr_DeviceInterface[3])(pDVar5,pVVar11);
  ::vk::checkResult(VVar15,"m_vk.queueWaitIdle(queue)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktDrawIndexedTest.cpp"
                    ,0x136);
  renderedFrame.m_format =
       ::vk::mapVkFormat((pDVar12->super_DrawIndexed).super_DrawTestsBaseClass.
                         m_colorAttachmentFormat);
  tcu::Texture2D::Texture2D(&referenceFrame,&renderedFrame.m_format,0x100,0x100);
  tcu::Texture2D::allocLevel(&referenceFrame,0);
  renderedFrame.m_format.order = R;
  renderedFrame.m_format.type = SNORM_INT8;
  renderedFrame.m_size.m_data[0] = 0;
  renderedFrame.m_size.m_data[1] = 0x3f800000;
  local_148 = __return_storage_ptr__;
  tcu::clear(referenceFrame.super_TextureLevelPyramid.m_access.
             super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
             _M_impl.super__Vector_impl_data._M_start,(Vec4 *)&renderedFrame);
  if (0 < referenceFrame.m_height) {
    local_138 = (double)referenceFrame.m_height * 0.5;
    dVar21 = (double)referenceFrame.m_width * 0.5;
    y = 0;
    local_130 = dVar21;
    do {
      if (0 < referenceFrame.m_width) {
        fVar19 = (float)((double)y / local_138) + -1.0;
        x = 0;
        do {
          if (((-0.6 <= fVar19 && fVar19 <= 0.3) &&
              (fVar20 = (float)((double)x / dVar21) + -1.0, -0.3 <= fVar20)) && (fVar20 <= 0.6)) {
            renderedFrame.m_format.order = R;
            renderedFrame.m_format.type = SNORM_INT8;
            renderedFrame.m_size.m_data[0] = 0x3f800000;
            renderedFrame.m_size.m_data[1] = 0x3f800000;
            tcu::PixelBufferAccess::setPixel
                      (referenceFrame.super_TextureLevelPyramid.m_access.
                       super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                       ._M_impl.super__Vector_impl_data._M_start,(Vec4 *)&renderedFrame,x,y,0);
            dVar21 = local_130;
          }
          x = x + 1;
        } while (referenceFrame.m_width != x);
      }
      y = y + 1;
    } while (y != referenceFrame.m_height);
  }
  this_01 = (local_160->super_DrawIndexed).super_DrawTestsBaseClass.m_colorTargetImage.m_ptr;
  pAVar17 = Context::getDefaultAllocator
                      ((local_160->super_DrawIndexed).super_DrawTestsBaseClass.super_TestInstance.
                       m_context);
  local_150 = 0;
  local_158 = 0;
  Image::readSurface(&renderedFrame,this_01,local_168,pAVar17,VK_IMAGE_LAYOUT_GENERAL,
                     (VkOffset3D)(ZEXT412(0) << 0x40),0x100,0x100,VK_IMAGE_ASPECT_COLOR_BIT,0,0);
  bVar14 = tcu::fuzzyCompare(local_140,"Result","Image comparison result",
                             &(referenceFrame.super_TextureLevelPyramid.m_access.
                               super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                              super_ConstPixelBufferAccess,&renderedFrame,0.05,COMPARE_LOG_RESULT);
  pTVar13 = local_148;
  __s = qpGetTestResultName((uint)!bVar14);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,__s,&local_169);
  pTVar13->m_code = (uint)!bVar14;
  (pTVar13->m_description)._M_dataplus._M_p = (pointer)&(pTVar13->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pTVar13->m_description,local_d8,local_d0 + (long)local_d8);
  if (local_d8 != local_c8) {
    operator_delete(local_d8,local_c8[0] + 1);
  }
  tcu::Texture3D::~Texture3D((Texture3D *)&referenceFrame);
  return pTVar13;
}

Assistant:

tcu::TestStatus DrawInstancedIndexed::iterate (void)
{
	tcu::TestLog &log		= m_context.getTestContext().getLog();
	const vk::VkQueue queue = m_context.getUniversalQueue();

	beginRenderPass();

	const vk::VkDeviceSize dataSize = m_indexes.size() * sizeof(deUint32);
	m_indexBuffer = Buffer::createAndAlloc(	m_vk, m_context.getDevice(),
											BufferCreateInfo(dataSize,
															 vk::VK_BUFFER_USAGE_INDEX_BUFFER_BIT),
											m_context.getDefaultAllocator(),
											vk::MemoryRequirement::HostVisible);

	deUint8* ptr = reinterpret_cast<deUint8*>(m_indexBuffer->getBoundMemory().getHostPtr());

	deMemcpy(ptr, &m_indexes[0], static_cast<size_t>(dataSize));
	vk::flushMappedMemoryRange(m_vk, m_context.getDevice(),
							   m_indexBuffer->getBoundMemory().getMemory(),
							   m_indexBuffer->getBoundMemory().getOffset(),
							   dataSize);

	const vk::VkDeviceSize vertexBufferOffset = 0;
	const vk::VkBuffer vertexBuffer = m_vertexBuffer->object();
	const vk::VkBuffer indexBuffer = m_indexBuffer->object();

	m_vk.cmdBindVertexBuffers(*m_cmdBuffer, 0, 1, &vertexBuffer, &vertexBufferOffset);
	m_vk.cmdBindIndexBuffer(*m_cmdBuffer, indexBuffer, 0, vk::VK_INDEX_TYPE_UINT32);
	m_vk.cmdBindPipeline(*m_cmdBuffer, vk::VK_PIPELINE_BIND_POINT_GRAPHICS, *m_pipeline);

	switch (m_topology)
	{
		case vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST:
			m_vk.cmdDrawIndexed(*m_cmdBuffer, 6, 4, 2, VERTEX_OFFSET, 2);
			break;
		case vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP:
			m_vk.cmdDrawIndexed(*m_cmdBuffer, 4, 4, 2, VERTEX_OFFSET, 2);
			break;
		case vk::VK_PRIMITIVE_TOPOLOGY_POINT_LIST:
		case vk::VK_PRIMITIVE_TOPOLOGY_LINE_LIST:
		case vk::VK_PRIMITIVE_TOPOLOGY_LINE_STRIP:
		case vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN:
		case vk::VK_PRIMITIVE_TOPOLOGY_LINE_LIST_WITH_ADJACENCY:
		case vk::VK_PRIMITIVE_TOPOLOGY_LINE_STRIP_WITH_ADJACENCY:
		case vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST_WITH_ADJACENCY:
		case vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP_WITH_ADJACENCY:
		case vk::VK_PRIMITIVE_TOPOLOGY_PATCH_LIST:
		case vk::VK_PRIMITIVE_TOPOLOGY_LAST:
			DE_FATAL("Topology not implemented");
			break;
		default:
			DE_FATAL("Unknown topology");
			break;
	}

	m_vk.cmdEndRenderPass(*m_cmdBuffer);
	m_vk.endCommandBuffer(*m_cmdBuffer);

	vk::VkSubmitInfo submitInfo =
	{
		vk::VK_STRUCTURE_TYPE_SUBMIT_INFO,	// VkStructureType			sType;
		DE_NULL,							// const void*				pNext;
		0,										// deUint32					waitSemaphoreCount;
		DE_NULL,								// const VkSemaphore*		pWaitSemaphores;
		(const vk::VkPipelineStageFlags*)DE_NULL,
		1,										// deUint32					commandBufferCount;
		&m_cmdBuffer.get(),					// const VkCommandBuffer*	pCommandBuffers;
		0,										// deUint32					signalSemaphoreCount;
		DE_NULL								// const VkSemaphore*		pSignalSemaphores;
	};
	VK_CHECK(m_vk.queueSubmit(queue, 1, &submitInfo, DE_NULL));

	VK_CHECK(m_vk.queueWaitIdle(queue));

	// Validation
	VK_CHECK(m_vk.queueWaitIdle(queue));

	tcu::Texture2D referenceFrame(vk::mapVkFormat(m_colorAttachmentFormat), (int)(0.5 + WIDTH), (int)(0.5 + HEIGHT));
	referenceFrame.allocLevel(0);

	const deInt32 frameWidth = referenceFrame.getWidth();
	const deInt32 frameHeight = referenceFrame.getHeight();

	tcu::clear(referenceFrame.getLevel(0), tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f));

	ReferenceImageInstancedCoordinates refInstancedCoords;

	for (int y = 0; y < frameHeight; y++)
	{
		const float yCoord = (float)(y / (0.5*frameHeight)) - 1.0f;

		for (int x = 0; x < frameWidth; x++)
		{
			const float xCoord = (float)(x / (0.5*frameWidth)) - 1.0f;

			if ((yCoord >= refInstancedCoords.bottom	&&
				 yCoord <= refInstancedCoords.top		&&
				 xCoord >= refInstancedCoords.left		&&
				 xCoord <= refInstancedCoords.right))
				referenceFrame.getLevel(0).setPixel(tcu::Vec4(0.0f, 0.0f, 1.0f, 1.0f), x, y);
		}
	}

	const vk::VkOffset3D zeroOffset = { 0, 0, 0 };
	const tcu::ConstPixelBufferAccess renderedFrame = m_colorTargetImage->readSurface(queue, m_context.getDefaultAllocator(),
		vk::VK_IMAGE_LAYOUT_GENERAL, zeroOffset, WIDTH, HEIGHT, vk::VK_IMAGE_ASPECT_COLOR_BIT);

	qpTestResult res = QP_TEST_RESULT_PASS;

	if (!tcu::fuzzyCompare(log, "Result", "Image comparison result",
		referenceFrame.getLevel(0), renderedFrame, 0.05f,
		tcu::COMPARE_LOG_RESULT)) {
		res = QP_TEST_RESULT_FAIL;
	}

	return tcu::TestStatus(res, qpGetTestResultName(res));

}